

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h1_s_cr(disp *this,string *param)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  char *in_stack_00000018;
  string local_30 [48];
  
  std::operator+(in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void h1_s_cr(std::string const &param)
	{
		v_= "h1_s_cr:"+param;
	}